

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O0

void idx2::Resize<int>(array<int> *Array,i64 NewSize)

{
  int local_2c;
  i64 local_28;
  i64 NewSize_local;
  array<int> *Array_local;
  i64 local_10;
  
  local_28 = NewSize;
  NewSize_local = (i64)Array;
  if (Array->Capacity < NewSize) {
    GrowCapacity<int>(Array,NewSize);
  }
  if (*(long *)(NewSize_local + 0x18) < local_28) {
    local_10 = NewSize_local;
    Array_local = (array<int> *)NewSize_local;
    local_2c = 0;
    Fill<int*,int>((int *)(*(long *)NewSize_local + *(long *)(NewSize_local + 0x18) * 4),
                   (int *)(*(long *)NewSize_local + local_28 * 4),&local_2c);
  }
  *(i64 *)(NewSize_local + 0x18) = local_28;
  return;
}

Assistant:

void
Resize(array<t>* Array, i64 NewSize)
{
  if (NewSize > Array->Capacity) // TODO: maybe grow the capacity until this is false
    GrowCapacity(Array, NewSize);
  if (Array->Size < NewSize)
    Fill(Begin(*Array) + Array->Size, Begin(*Array) + NewSize, t{});
  Array->Size = NewSize;
}